

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(void)

{
  putchar(0x42);
  printf("%s","ijqwj8f908qje098fjasjdfad");
  printf("%s","jaisodjpfoaisjdpfspjoiajsd");
  printf("%s","kaj;slkdjfp48j098jasoidjfasdad");
  printf("%s","0./askjfdap9isdf");
  printf("%s","akjsdpjaisdf");
  printf("%s","984uuajsdf");
  printf("%s","9iujfalksjdfaifjalkdsjfajsf489g");
  printf("%s",0);
  return 0;
}

Assistant:

int
main()
{
    const char *res;

    res = str_switch(KEY1);
    printf("%s", res);
    assert(strcmp(res, VALUE1) == 0);

    res = str_switch(KEY2);
    printf("%s", res);
    assert(strcmp(res, VALUE2) == 0);

    res = str_switch(KEY3);
    printf("%s", res);
    assert(strcmp(res, VALUE3) == 0);

    res = str_switch(KEY4);
    printf("%s", res);
    assert(strcmp(res, VALUE4) == 0);

    res = str_switch(KEY5);
    printf("%s", res);
    assert(strcmp(res, VALUE5) == 0);

    res = str_switch(KEY6);
    printf("%s", res);
    assert(strcmp(res, VALUE6) == 0);

    res = str_switch(KEY7);
    printf("%s", res);
    assert(strcmp(res, VALUE7) == 0);

    res = str_switch(KEY8);
    printf("%s", res);
    assert(strcmp(res, VALUE8) == 0);

    res = str_switch("");
    printf("%s", res);
    assert(res == NULL);

    return res != NULL;
}